

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O3

void __thiscall trackerboy::apu::Sweep::reset(Sweep *this)

{
  this->mShadow = 0;
  this->mSubtraction = false;
  this->mTime = '\0';
  this->mShift = '\0';
  this->mCounter = '\0';
  this->mRegister = '\0';
  return;
}

Assistant:

void Sweep::reset() noexcept {
    mSubtraction = false;
    mTime = 0;
    mShift = 0;
    mCounter = 0;
    mRegister = 0;
    mShadow = 0;
}